

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MyDB_BufferManager.cc
# Opt level: O2

MyDB_PageHandle __thiscall
MyDB_BufferManager::getPinnedPage(MyDB_BufferManager *this,MyDB_TablePtr *table,long index)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  MyDB_PageHandle MVar1;
  __shared_ptr<MyDB_Table,_(__gnu_cxx::_Lock_policy)2> local_30;
  
  std::__shared_ptr<MyDB_Table,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_30,(__shared_ptr<MyDB_Table,_(__gnu_cxx::_Lock_policy)2> *)index);
  getPage(this,table,(long)&local_30);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_30._M_refcount);
  *(undefined1 *)(**(long **)&(this->pageMap)._M_t._M_impl + 8) = 1;
  MVar1.super___shared_ptr<MyDB_PageHandleBase,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  MVar1.super___shared_ptr<MyDB_PageHandleBase,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (MyDB_PageHandle)MVar1.super___shared_ptr<MyDB_PageHandleBase,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

MyDB_PageHandle MyDB_BufferManager :: getPinnedPage (MyDB_TablePtr table, long index) {
	MyDB_PageHandle phd = getPage (table, index);
	phd -> pagePtr -> isPined = true;
	return phd;
}